

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v10::detail::fwrite_fully(void *ptr,size_t count,FILE *stream)

{
  uint uVar1;
  size_t sVar2;
  undefined8 uVar3;
  uint *puVar4;
  format_string<> fmt;
  
  sVar2 = fwrite(ptr,1,count,(FILE *)stream);
  if (count <= sVar2) {
    return;
  }
  uVar3 = __cxa_allocate_exception(0x20);
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  check_format_string<FMT_COMPILE_STRING,_0>();
  fmt.str_.data_ = (char *)(ulong)uVar1;
  fmt.str_.size_ = (size_t)"cannot write to file";
  system_error<>((int)uVar3,fmt);
  __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

inline void fwrite_fully(const void* ptr, size_t count, FILE* stream) {
  size_t written = std::fwrite(ptr, 1, count, stream);
  if (written < count)
    FMT_THROW(system_error(errno, FMT_STRING("cannot write to file")));
}